

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Rule * new_rule(Grammar *g,Production *p)

{
  Rule *__s;
  Elem *pEVar1;
  Rule *r;
  Production *p_local;
  Grammar *g_local;
  
  __s = (Rule *)malloc(0xa8);
  memset(__s,0,0xa8);
  __s->prod = p;
  pEVar1 = new_elem();
  __s->end = pEVar1;
  __s->end->kind = ELEM_END;
  __s->end->rule = __s;
  __s->action_index = g->action_index;
  return __s;
}

Assistant:

Rule *new_rule(Grammar *g, Production *p) {
  Rule *r = MALLOC(sizeof(Rule));
  memset(r, 0, sizeof(Rule));
  r->prod = p;
  r->end = new_elem();
  r->end->kind = ELEM_END;
  r->end->rule = r;
  r->action_index = g->action_index;
  return r;
}